

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::SharedCtor
          (NonMaximumSuppressionLayerParams *this)

{
  NonMaximumSuppressionLayerParams *this_local;
  
  memset(&this->iouthreshold_,0,0x11);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void NonMaximumSuppressionLayerParams::SharedCtor() {
  ::memset(&iouthreshold_, 0, reinterpret_cast<char*>(&perclasssuppression_) -
    reinterpret_cast<char*>(&iouthreshold_) + sizeof(perclasssuppression_));
  _cached_size_ = 0;
}